

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O0

Output_GetCameraWindowSize * __thiscall
ViconDataStreamSDK::CPP::Client::GetCameraWindowSize
          (Output_GetCameraWindowSize *__return_storage_ptr__,Client *this,string *i_rCameraName)

{
  Enum i_Result;
  Enum EVar1;
  element_type *this_00;
  Output_GetCameraWindowSize *Output;
  string *i_rCameraName_local;
  Client *this_local;
  
  this_00 = std::
            __shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this->m_pClientImpl);
  i_Result = Core::VClient::GetCameraWindowSize
                       (this_00,i_rCameraName,&__return_storage_ptr__->WindowStartX,
                        &__return_storage_ptr__->WindowStartY,&__return_storage_ptr__->WindowWidth,
                        &__return_storage_ptr__->WindowHeight);
  EVar1 = Adapt(i_Result);
  __return_storage_ptr__->Result = EVar1;
  return __return_storage_ptr__;
}

Assistant:

CLASS_DECLSPEC
  Output_GetCameraWindowSize Client::GetCameraWindowSize( const std::string & i_rCameraName ) const
  {
    Output_GetCameraWindowSize Output;
    Output.Result = Adapt(m_pClientImpl->m_pCoreClient->GetCameraWindowSize(
      i_rCameraName,
      Output.WindowStartX,
      Output.WindowStartY,
      Output.WindowWidth,
      Output.WindowHeight ));

    return Output;
  }